

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckType
          (SharedValidator *this,Location *loc,Type actual,Type expected,char *desc)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Enum EVar3;
  Type local_78;
  Type local_70;
  string local_68;
  string local_48;
  
  local_78 = expected;
  local_70 = actual;
  RVar2 = TypeChecker::CheckType(actual,expected);
  EVar3 = Ok;
  if (RVar2.enum_ == Error) {
    Type::GetName_abi_cxx11_(&local_48,&local_70);
    _Var1._M_p = local_48._M_dataplus._M_p;
    Type::GetName_abi_cxx11_(&local_68,&local_78);
    PrintError(this,loc,"type mismatch at %s. got %s, expected %s",desc,_Var1._M_p,
               local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::CheckType(const Location& loc,
                                  Type actual,
                                  Type expected,
                                  const char* desc) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc, "type mismatch at %s. got %s, expected %s", desc,
               actual.GetName().c_str(), expected.GetName().c_str());
    return Result::Error;
  }
  return Result::Ok;
}